

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall
siamese::EncoderPacketWindow::RemoveBefore(EncoderPacketWindow *this,uint firstKeptColumn)

{
  LogStringBuffer *buffer_00;
  int in_ESI;
  long in_RDI;
  uint firstKeptElement;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  char *in_stack_fffffffffffff4f8;
  LogStringBuffer *in_stack_fffffffffffff500;
  undefined8 *puVar1;
  LogStringBuffer *in_stack_fffffffffffff538;
  OutputWorker *in_stack_fffffffffffff540;
  OutputWorker *this_00;
  uint local_a48;
  uint local_a44 [8];
  uint local_a24;
  uint local_a14;
  char *local_a10;
  uint *local_a08;
  char *local_a00;
  undefined8 *local_9f8;
  char *local_9f0;
  uint *local_9e8;
  char *local_9e0;
  undefined8 *local_9d8;
  uint *local_9d0;
  char *local_9c8;
  uint *local_9c0;
  char *local_9b8;
  undefined8 *local_9b0;
  int local_9a8;
  char *local_9a0;
  uint *local_998;
  char *local_990;
  undefined4 local_984;
  undefined8 *local_980;
  undefined4 local_974;
  undefined8 *local_970;
  undefined1 local_958 [16];
  ostream aoStack_948 [376];
  char *local_7d0;
  uint *local_7c8;
  char *local_7c0;
  undefined4 local_7b4;
  undefined8 *local_7b0;
  char *local_7a8;
  uint *local_7a0;
  char *local_798;
  undefined *local_790;
  undefined1 *local_788;
  undefined8 *local_780;
  undefined *local_778;
  undefined1 *local_770;
  undefined8 *local_768;
  undefined *local_760;
  undefined1 *local_758;
  char *local_750;
  uint *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined8 *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined8 *local_718;
  char *local_710;
  uint *local_708;
  undefined1 *local_700;
  undefined8 *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined8 *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  uint *local_6c8;
  undefined1 *local_6c0;
  undefined8 *local_6b8;
  uint *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  char *local_690;
  uint *local_688;
  char *local_680;
  undefined4 local_674;
  undefined8 *local_670;
  undefined4 local_664;
  undefined8 *local_660;
  undefined1 local_648 [16];
  ostream aoStack_638 [376];
  char *local_4c0;
  uint *local_4b8;
  char *local_4b0;
  undefined4 local_4a4;
  undefined8 *local_4a0;
  char *local_498;
  uint *local_490;
  char *local_488;
  undefined *local_480;
  undefined1 *local_478;
  undefined8 *local_470;
  undefined *local_468;
  undefined1 *local_460;
  undefined8 *local_458;
  undefined *local_450;
  undefined1 *local_448;
  char *local_440;
  uint *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined8 *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined8 *local_408;
  char *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  uint *local_3e8;
  undefined1 *local_3e0;
  undefined8 *local_3d8;
  uint *local_3d0;
  undefined1 *local_3c8;
  undefined8 *local_3c0;
  uint *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  OutputWorker *local_398;
  char *local_390;
  undefined1 *local_388;
  uint *local_380;
  char *local_378;
  uint *local_370;
  char *local_368;
  undefined4 local_35c;
  undefined8 *local_358;
  undefined4 local_34c;
  undefined8 *local_348;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  uint *local_1a8;
  char *local_1a0;
  uint *local_198;
  char *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  uint *local_178;
  char *local_170;
  uint *local_168;
  char *local_160;
  undefined *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  undefined *local_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined *local_128;
  undefined1 *local_120;
  uint *local_118;
  char *local_110;
  uint *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  uint *local_c0;
  char *local_b8;
  uint *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  uint *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  uint *local_80;
  undefined1 *local_78;
  uint *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  uint *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  uint *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  if ((*(byte *)(in_RDI + 0x438) & 1) == 0) {
    local_9a8 = *(int *)(in_RDI + 0x18);
    local_a48 = in_ESI - local_9a8 & 0x3fffff;
    local_a24 = local_a48;
    if (local_a48 < *(uint *)(in_RDI + 0x14)) {
      local_9b0 = &Logger;
      local_9b8 = "Remove before column ";
      local_9c0 = local_a44;
      local_9c8 = " element ";
      local_9d0 = &local_a48;
      local_358 = &Logger;
      local_35c = 2;
      local_368 = "Remove before column ";
      local_378 = " element ";
      local_348 = &Logger;
      local_34c = 2;
      if (DAT_002b6400 < 3) {
        local_180 = &Logger;
        local_184 = 2;
        local_190 = "Remove before column ";
        local_1a0 = " element ";
        local_380 = local_9d0;
        local_370 = local_9c0;
        local_1a8 = local_9d0;
        local_198 = local_9c0;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,Trace);
        local_158 = &DAT_002b6430;
        local_148 = &Logger;
        local_160 = local_190;
        local_168 = local_198;
        local_170 = local_1a0;
        local_178 = local_1a8;
        local_130 = &Logger;
        local_150 = local_330;
        local_140 = local_158;
        local_138 = local_330;
        local_128 = local_158;
        local_120 = local_330;
        std::operator<<(aoStack_320,(string *)&DAT_002b6430);
        local_f0 = &Logger;
        local_f8 = local_150;
        local_100 = local_160;
        local_108 = local_168;
        local_110 = local_170;
        local_118 = local_178;
        local_d8 = &Logger;
        local_e0 = local_150;
        local_e8 = local_160;
        local_c8 = local_150;
        local_d0 = local_160;
        std::operator<<((ostream *)(local_150 + 0x10),local_160);
        local_a0 = &Logger;
        local_a8 = local_f8;
        local_b0 = local_108;
        local_b8 = local_110;
        local_c0 = local_118;
        local_88 = &Logger;
        local_90 = local_f8;
        local_98 = local_108;
        local_78 = local_f8;
        local_80 = local_108;
        std::ostream::operator<<((ostream *)(local_f8 + 0x10),*local_108);
        local_58 = &Logger;
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        puVar1 = &Logger;
        local_40 = &Logger;
        local_48 = local_a8;
        local_50 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
        local_30 = local_60;
        local_38 = local_70;
        local_18 = local_60;
        local_20 = local_70;
        local_28 = puVar1;
        std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1d65d2);
      }
      if (*(uint *)(in_RDI + 0x20) < local_a48) {
        *(uint *)(in_RDI + 0x20) = local_a48;
      }
    }
    else {
      local_a14 = local_a48;
      if (local_a48 < 0x200000) {
        *(undefined4 *)(in_RDI + 0x14) = 0;
        local_9d8 = &Logger;
        local_9e0 = "Remove before column ";
        local_9e8 = local_a44;
        local_9f0 = " - Removed everything";
        local_670 = &Logger;
        local_674 = 2;
        local_680 = "Remove before column ";
        local_690 = " - Removed everything";
        local_660 = &Logger;
        local_664 = 2;
        if (DAT_002b6400 < 3) {
          local_4a0 = &Logger;
          local_4a4 = 2;
          local_4b0 = "Remove before column ";
          local_4c0 = " - Removed everything";
          local_688 = local_9e8;
          local_4b8 = local_9e8;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,Trace);
          local_480 = &DAT_002b6430;
          local_470 = &Logger;
          local_488 = local_4b0;
          local_490 = local_4b8;
          local_498 = local_4c0;
          local_458 = &Logger;
          local_478 = local_648;
          local_468 = local_480;
          local_460 = local_648;
          local_450 = local_480;
          local_448 = local_648;
          std::operator<<(aoStack_638,(string *)&DAT_002b6430);
          local_420 = &Logger;
          local_428 = local_478;
          local_430 = local_488;
          local_438 = local_490;
          local_440 = local_498;
          local_408 = &Logger;
          local_410 = local_478;
          local_418 = local_488;
          local_3f8 = local_478;
          local_400 = local_488;
          std::operator<<((ostream *)(local_478 + 0x10),local_488);
          local_3d8 = &Logger;
          local_3e0 = local_428;
          local_3e8 = local_438;
          local_3f0 = local_440;
          this_00 = (OutputWorker *)&Logger;
          local_3c0 = &Logger;
          local_3c8 = local_428;
          local_3d0 = local_438;
          local_3b0 = local_428;
          local_3b8 = local_438;
          std::ostream::operator<<((ostream *)(local_428 + 0x10),*local_438);
          local_3a0 = local_3e0;
          local_3a8 = local_3f0;
          local_388 = local_3e0;
          local_390 = local_3f0;
          local_398 = this_00;
          std::operator<<((ostream *)(local_3e0 + 0x10),local_3f0);
          buffer_00 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_00,buffer_00);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1d607f);
        }
      }
      else {
        local_9f8 = &Logger;
        local_a00 = "Remove before column ";
        local_a08 = local_a44;
        local_a10 = " - Ignored before window";
        local_980 = &Logger;
        local_984 = 2;
        local_990 = "Remove before column ";
        local_9a0 = " - Ignored before window";
        local_970 = &Logger;
        local_974 = 2;
        if (DAT_002b6400 < 3) {
          local_7b0 = &Logger;
          local_7b4 = 2;
          local_7c0 = "Remove before column ";
          local_7d0 = " - Ignored before window";
          local_998 = local_a08;
          local_7c8 = local_a08;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,Trace);
          local_790 = &DAT_002b6430;
          local_780 = &Logger;
          local_798 = local_7c0;
          local_7a0 = local_7c8;
          local_7a8 = local_7d0;
          local_768 = &Logger;
          local_788 = local_958;
          local_778 = local_790;
          local_770 = local_958;
          local_760 = local_790;
          local_758 = local_958;
          std::operator<<(aoStack_948,(string *)&DAT_002b6430);
          local_730 = &Logger;
          local_738 = local_788;
          local_740 = local_798;
          local_748 = local_7a0;
          local_750 = local_7a8;
          local_718 = &Logger;
          local_720 = local_788;
          local_728 = local_798;
          local_698 = local_788;
          local_6a0 = local_798;
          std::operator<<((ostream *)(local_788 + 0x10),local_798);
          local_6f8 = &Logger;
          local_700 = local_738;
          local_708 = local_748;
          local_710 = local_750;
          local_6b8 = &Logger;
          local_6c0 = local_738;
          local_6c8 = local_748;
          local_6a8 = local_738;
          local_6b0 = local_748;
          std::ostream::operator<<((ostream *)(local_738 + 0x10),*local_748);
          local_6e0 = &Logger;
          local_6e8 = local_700;
          local_6f0 = local_710;
          local_6d0 = local_700;
          local_6d8 = local_710;
          std::operator<<((ostream *)(local_700 + 0x10),local_710);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1d5c31);
        }
      }
    }
  }
  return;
}

Assistant:

void EncoderPacketWindow::RemoveBefore(unsigned firstKeptColumn)
{
    if (EmergencyDisabled) {
        return;
    }

    // Convert column to element, handling wrap-around:
    const unsigned firstKeptElement = ColumnToElement(firstKeptColumn);

    // If the column is outside of the window:
    if (InvalidElement(firstKeptElement))
    {
        // If the element was before the window:
        if (IsColumnDeltaNegative(firstKeptElement)) {
            Logger.Info("Remove before column ", firstKeptColumn, " - Ignored before window");
        }
        else
        {
            // Removed everything
            Count = 0;

            Logger.Info("Remove before column ", firstKeptColumn, " - Removed everything");
        }
    }
    else
    {
        Logger.Info("Remove before column ", firstKeptColumn, " element ", firstKeptElement);

        // Mark these elements for removal next time we generate output
        if (FirstUnremovedElement < firstKeptElement) {
            FirstUnremovedElement = firstKeptElement;
        }
    }
}